

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

int ma_device__jack_process_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  ma_pcm_rb *pRB;
  ulong outputFrameCount;
  ma_data_converter *pmVar1;
  ma_result mVar2;
  uint uVar3;
  ma_int32 mVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ma_uint64 mVar8;
  code *pcVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  undefined4 *puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ma_uint32 mVar17;
  void *pvVar18;
  int iVar19;
  long lVar20;
  ma_uint64 framesProcessedInClientFormat;
  ma_uint32 framesToProcessInClientFormat;
  ma_uint64 framesProcessedInDeviceFormat;
  uint local_1078;
  void *local_1070;
  ulong local_1068;
  uint local_105c;
  ma_data_converter *local_1058;
  long local_1050;
  ma_pcm_rb *local_1048;
  ma_data_converter *local_1040;
  ulong local_1038 [513];
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515a,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  local_1050 = *pUserData;
  if (local_1050 == 0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515d,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  outputFrameCount = (ulong)frameCount;
  uVar3 = *(uint *)((long)pUserData + 8);
  if ((uVar3 & 0xfffffffe) == 2) {
    if (*(int *)((long)pUserData + 0x2bcc) != 0) {
      lVar20 = 0;
      uVar16 = 0;
      do {
        lVar7 = (**(code **)(local_1050 + 0x180))
                          (*(undefined8 *)((long)pUserData + uVar16 * 8 + 0x5478),outputFrameCount);
        uVar3 = *(uint *)((long)pUserData + 0x2bcc);
        if (lVar7 != 0 && frameCount != 0) {
          puVar13 = (undefined4 *)(*(long *)((long)pUserData + 0x5580) + lVar20);
          lVar15 = 0;
          do {
            *puVar13 = *(undefined4 *)(lVar7 + lVar15 * 4);
            lVar15 = lVar15 + 1;
            puVar13 = puVar13 + uVar3;
          } while (frameCount != (ma_jack_nframes_t)lVar15);
        }
        uVar16 = uVar16 + 1;
        lVar20 = lVar20 + 4;
      } while (uVar16 < uVar3);
      uVar3 = *(uint *)((long)pUserData + 8);
    }
    pvVar18 = *(void **)((long)pUserData + 0x5580);
    if (uVar3 == 3) {
      if (frameCount == 0) {
        __assert_fail("frameCountInDeviceFormat > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2367,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      if (pvVar18 == (void *)0x0) {
        __assert_fail("pFramesInDeviceFormat != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2368,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      pRB = (ma_pcm_rb *)((long)pUserData + 0x5588);
      local_1058 = (ma_data_converter *)((long)pUserData + 0x2c00);
      iVar19 = 0;
      while( true ) {
        local_105c = (uint)(0x1000 / (ulong)(uint)((&DAT_001158a0)
                                                   [*(uint *)((long)pUserData + 0x2ba0)] *
                                                  *(int *)((long)pUserData + 0x2ba4)));
        mVar2 = ma_pcm_rb_acquire_write(pRB,&local_105c,&local_1070);
        if (mVar2 != 0) break;
        uVar16 = (ulong)local_105c;
        if ((uVar16 == 0) &&
           (uVar3 = ma_pcm_rb_pointer_distance(pRB),
           uVar3 == *(uint *)((long)pUserData + 0x5590) /
                    (uint)((&DAT_001158a0)[*(uint *)((long)pUserData + 0x55c8)] *
                          *(int *)((long)pUserData + 0x55cc)))) goto LAB_00110046;
        local_1038[0] = (ulong)(frameCount - iVar19);
        local_1068 = uVar16;
        mVar2 = ma_data_converter_process_pcm_frames
                          (local_1058,pvVar18,local_1038,local_1070,&local_1068);
        uVar16 = local_1038[0];
        if (mVar2 != 0) goto LAB_00110046;
        mVar17 = (ma_uint32)local_1038[0];
        mVar2 = ma_pcm_rb_commit_write(pRB,mVar17,local_1070);
        if (mVar2 != 0) {
          lVar20 = *pUserData;
          if ((lVar20 == 0) || (pcVar9 = *(code **)(lVar20 + 8), pcVar9 == (code *)0x0))
          goto LAB_00110046;
          pcVar11 = "Failed to commit capture PCM frames to ring buffer.";
          goto LAB_00110334;
        }
        if (local_1068 == 0 && uVar16 == 0) goto LAB_00110046;
        iVar19 = iVar19 + mVar17;
        pvVar18 = (void *)((long)pvVar18 +
                          uVar16 * (uint)(*(int *)((long)pUserData + 0x2bcc) *
                                         (&DAT_001158a0)[*(uint *)((long)pUserData + 0x2bc8)]));
      }
      lVar20 = *pUserData;
      if ((lVar20 != 0) && (pcVar9 = *(code **)(lVar20 + 8), pcVar9 != (code *)0x0)) {
        pcVar11 = "Failed to acquire capture PCM frames from ring buffer.";
LAB_00110334:
        (*pcVar9)(lVar20,pUserData,1,pcVar11);
      }
    }
    else {
      ma_device__send_frames_to_client((ma_device *)pUserData,frameCount,pvVar18);
    }
LAB_00110046:
    uVar3 = *(uint *)((long)pUserData + 8);
  }
  if (uVar3 == 1) {
    ma_device__read_frames_from_client
              ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5578));
  }
  else {
    if (uVar3 != 3) {
      return 0;
    }
    if (frameCount == 0) {
      __assert_fail("frameCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a3,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    local_1058 = *(ma_data_converter **)((long)pUserData + 0x5578);
    if (local_1058 == (ma_data_converter *)0x0) {
      __assert_fail("pFramesInInternalFormat != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a4,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    local_1078 = frameCount;
    if ((*(byte *)((long)pUserData + 0x2a90) & 8) != 0) {
      mVar8 = ma_resampler_get_required_input_frame_count
                        ((ma_resampler *)((long)pUserData + 0x2420),outputFrameCount);
      local_1078 = (uint)mVar8;
      if (local_1078 == 0) goto LAB_0011026c;
    }
    local_1048 = (ma_pcm_rb *)((long)pUserData + 0x5588);
    local_1040 = (ma_data_converter *)((long)pUserData + 0x328);
    iVar19 = 0;
    uVar3 = 0;
    do {
      if (*(int *)((long)pUserData + 0x10) != 2) break;
      uVar14 = (uint)(0x1000 / (ulong)(uint)((&DAT_001158a0)[*(uint *)((long)pUserData + 0x2c8)] *
                                            *(int *)((long)pUserData + 0x2cc)));
      uVar12 = local_1078 - uVar3;
      if (uVar14 < local_1078 - uVar3) {
        uVar12 = uVar14;
      }
      uVar14 = (&DAT_001158a0)[*(uint *)((long)pUserData + 0x55c8)] *
               *(int *)((long)pUserData + 0x55cc);
      if ((int)(*(uint *)((long)pUserData + 0x559c) ^ *(uint *)((long)pUserData + 0x55a0)) < 0) {
        uVar10 = *(uint *)((long)pUserData + 0x5590);
      }
      else {
        uVar10 = *(uint *)((long)pUserData + 0x55a0) & 0x7fffffff;
      }
      uVar10 = uVar10 - (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff);
      if (uVar12 * uVar14 < uVar10) {
        uVar10 = uVar12 * uVar14;
      }
      pvVar18 = (void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                        *(long *)((long)pUserData + 0x5588));
      mVar17 = (ma_uint32)((ulong)uVar10 / (ulong)uVar14);
      if (uVar10 < uVar14) {
        mVar4 = ma_pcm_rb_pointer_distance(local_1048);
        if (mVar4 == 0) break;
      }
      else {
        ma_device__on_data((ma_device *)pUserData,local_1038,pvVar18,mVar17);
      }
      pmVar1 = local_1058;
      if ((void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                  *(long *)((long)pUserData + 0x5588)) != pvVar18) break;
      uVar12 = (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
               *(int *)((long)pUserData + 0x55cc) * mVar17 *
               (&DAT_001158a0)[*(uint *)((long)pUserData + 0x55c8)];
      if (*(uint *)((long)pUserData + 0x5590) < uVar12) break;
      uVar5 = *(uint *)((long)pUserData + 0x559c) & 0x80000000;
      uVar6 = uVar5 ^ 0x80000000;
      if (uVar12 != *(uint *)((long)pUserData + 0x5590)) {
        uVar6 = uVar12 | uVar5;
      }
      LOCK();
      *(uint *)((long)pUserData + 0x559c) = uVar6;
      UNLOCK();
      local_1070 = (void *)(ulong)(frameCount - iVar19);
      local_1068 = (ulong)uVar10 / (ulong)uVar14;
      ma_data_converter_process_pcm_frames
                (local_1040,local_1038,&local_1068,local_1058,(ma_uint64 *)&local_1070);
      uVar3 = uVar3 + (int)local_1068;
      iVar19 = iVar19 + (int)local_1070;
      local_1058 = (ma_data_converter *)
                   ((pmVar1->config).channelMapIn +
                   (ulong)(uint)((&DAT_001158a0)[*(uint *)((long)pUserData + 0x2f0)] *
                                *(int *)((long)pUserData + 0x2f4)) * (long)local_1070 + -0x18);
    } while (uVar3 < local_1078);
  }
LAB_0011026c:
  if (*(int *)((long)pUserData + 0x2f4) != 0) {
    lVar20 = 0;
    uVar16 = 0;
    do {
      lVar7 = (**(code **)(local_1050 + 0x180))
                        (*(undefined8 *)((long)pUserData + uVar16 * 8 + 0x5378),outputFrameCount);
      uVar3 = *(uint *)((long)pUserData + 0x2f4);
      if (lVar7 != 0 && frameCount != 0) {
        puVar13 = (undefined4 *)(*(long *)((long)pUserData + 0x5578) + lVar20);
        lVar15 = 0;
        do {
          *(undefined4 *)(lVar7 + lVar15 * 4) = *puVar13;
          lVar15 = lVar15 + 1;
          puVar13 = puVar13 + uVar3;
        } while (frameCount != (ma_jack_nframes_t)lVar15);
      }
      uVar16 = uVar16 + 1;
      lVar20 = lVar20 + 4;
    } while (uVar16 < uVar3);
  }
  return 0;
}

Assistant:

static int ma_device__jack_process_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice;
    ma_context* pContext;
    ma_uint32 iChannel;

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        /* Channels need to be interleaved. */
        for (iChannel = 0; iChannel < pDevice->capture.internalChannels; ++iChannel) {
            const float* pSrc = (const float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsCapture[iChannel], frameCount);
            if (pSrc != NULL) {
                float* pDst = pDevice->jack.pIntermediaryBufferCapture + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += pDevice->capture.internalChannels;
                    pSrc += 1;
                }
            }
        }

        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_capture(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture, &pDevice->jack.duplexRB);
        } else {
            ma_device__send_frames_to_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture);
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_playback(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback, &pDevice->jack.duplexRB);
        } else {
            ma_device__read_frames_from_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback);
        }

        /* Channels need to be deinterleaved. */
        for (iChannel = 0; iChannel < pDevice->playback.internalChannels; ++iChannel) {
            float* pDst = (float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[iChannel], frameCount);
            if (pDst != NULL) {
                const float* pSrc = pDevice->jack.pIntermediaryBufferPlayback + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += 1;
                    pSrc += pDevice->playback.internalChannels;
                }
            }
        }
    }

    return 0;
}